

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_ops.cc
# Opt level: O0

filemgr_ops * get_filemgr_ops(void)

{
  filemgr_ops *pfVar1;
  
  pfVar1 = get_linux_filemgr_ops();
  return pfVar1;
}

Assistant:

struct filemgr_ops * get_filemgr_ops()
{
#if defined(WIN32) || defined(_WIN32)
    // windows
    return get_win_filemgr_ops();
#else
    // linux, mac os x
    return get_linux_filemgr_ops();
#endif
}